

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall libtorrent::aux::session_impl::start_session(session_impl *this)

{
  bool bVar1;
  uint uVar2;
  undefined8 uVar3;
  context_handle_type c;
  peer_class *ppVar4;
  int *piVar5;
  type local_f8;
  int local_f0 [3];
  uint local_e4;
  uint local_e0;
  int max_files;
  uint local_d8;
  uint local_d4;
  uint local_d0;
  allocator<char> local_c9;
  string local_c8;
  uint local_a8;
  allocator<char> local_a1;
  string local_a0;
  uint local_80;
  allocator<char> local_69;
  string local_68;
  uint local_44;
  string local_40;
  undefined1 local_20 [8];
  error_code ec;
  session_impl *this_local;
  
  ec.cat_ = (error_category *)this;
  session_log(this,"start session");
  boost::system::error_code::error_code((error_code *)local_20);
  boost::asio::ssl::context::set_default_verify_paths(&this->m_ssl_ctx,(error_code *)local_20);
  bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)local_20);
  if (bVar1) {
    boost::system::error_code::message_abi_cxx11_(&local_40,(error_code *)local_20);
    uVar3 = ::std::__cxx11::string::c_str();
    session_log(this,"SSL set_default verify_paths failed: %s",uVar3);
    ::std::__cxx11::string::~string((string *)&local_40);
  }
  boost::system::error_code::clear((error_code *)local_20);
  boost::asio::ssl::context::set_verify_mode(&this->m_peer_ssl_ctx,0,(error_code *)local_20);
  c = aux::ssl::get_handle(&this->m_peer_ssl_ctx);
  aux::ssl::set_server_name_callback
            (c,anon_unknown_119::ssl_server_name_callback,this,(error_code *)local_20);
  this->m_next_dht_torrent = 0;
  this->m_next_lsd_torrent = 0;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"global",&local_69);
  local_44 = (uint)peer_class_pool::new_peer_class(&this->m_classes,&local_68);
  (this->m_global_class).m_val = local_44;
  ::std::__cxx11::string::~string((string *)&local_68);
  ::std::allocator<char>::~allocator(&local_69);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"tcp",&local_a1);
  local_80 = (uint)peer_class_pool::new_peer_class(&this->m_classes,&local_a0);
  (this->m_tcp_peer_class).m_val = local_80;
  ::std::__cxx11::string::~string((string *)&local_a0);
  ::std::allocator<char>::~allocator(&local_a1);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"local",&local_c9);
  local_a8 = (uint)peer_class_pool::new_peer_class(&this->m_classes,&local_c8);
  (this->m_local_peer_class).m_val = local_a8;
  ::std::__cxx11::string::~string((string *)&local_c8);
  ::std::allocator<char>::~allocator(&local_c9);
  local_d0 = (this->m_local_peer_class).m_val;
  ppVar4 = peer_class_pool::at(&this->m_classes,(peer_class_t)local_d0);
  ppVar4->ignore_unchoke_slots = true;
  local_d4 = (this->m_local_peer_class).m_val;
  ppVar4 = peer_class_pool::at(&this->m_classes,(peer_class_t)local_d4);
  ppVar4->connection_limit_factor = 0x96;
  init_peer_class_filter(this,true);
  local_d8 = (this->m_tcp_peer_class).m_val;
  peer_class_type_filter::add(&this->m_peer_class_type_filter,tcp_socket,(peer_class_t)local_d8);
  max_files = (this->m_tcp_peer_class).m_val;
  peer_class_type_filter::add
            (&this->m_peer_class_type_filter,ssl_tcp_socket,(peer_class_t)max_files);
  local_e0 = (this->m_tcp_peer_class).m_val;
  peer_class_type_filter::add(&this->m_peer_class_type_filter,i2p_socket,(peer_class_t)local_e0);
  session_log(this,"version: %s revision: %lx","2.1.0.0",0x283cea598);
  local_e4 = max_open_files();
  local_f0[2] = session_settings::get_int(&this->m_settings,0x4055);
  local_f0[1] = 5;
  local_f0[0] = (int)((local_e4 - 0x14) * 8) / 10;
  piVar5 = ::std::max<int>(local_f0 + 1,local_f0);
  piVar5 = ::std::min<int>(local_f0 + 2,piVar5);
  session_settings::set_int(&this->m_settings,0x4055,*piVar5);
  bVar1 = should_log(this);
  if (bVar1) {
    uVar2 = session_settings::get_int(&this->m_settings,0x4055);
    session_log(this,"max-connections: %d max-files: %d",(ulong)uVar2,(ulong)local_e4);
  }
  local_f8.this = this;
  boost::asio::post<boost::asio::io_context,libtorrent::aux::session_impl::start_session()::__0>
            (this->m_io_context,&local_f8,(type *)0x0);
  return;
}

Assistant:

void session_impl::start_session()
	{
#ifndef TORRENT_DISABLE_LOGGING
		session_log("start session");
#endif

#if TORRENT_USE_SSL
		error_code ec;
		m_ssl_ctx.set_default_verify_paths(ec);
#ifndef TORRENT_DISABLE_LOGGING
		if (ec) session_log("SSL set_default verify_paths failed: %s", ec.message().c_str());
		ec.clear();
#endif
#if defined TORRENT_WINDOWS && defined TORRENT_USE_OPENSSL && !defined TORRENT_WINRT
		// TODO: come up with some abstraction to do this for gnutls as well
		// load certificates from the windows system certificate store
		X509_STORE* store = X509_STORE_new();
		if (store)
		{
			HCERTSTORE system_store = CertOpenSystemStoreA(0, "ROOT");
			// this is best effort
			if (system_store)
			{
				CERT_CONTEXT const* ctx = nullptr;
				while ((ctx = CertEnumCertificatesInStore(system_store, ctx)) != nullptr)
				{
					unsigned char const* cert_ptr = reinterpret_cast<unsigned char const*>(ctx->pbCertEncoded);
					X509* x509 = d2i_X509(nullptr, &cert_ptr, ctx->cbCertEncoded);
					// this is best effort
					if (!x509) continue;
					X509_STORE_add_cert(store, x509);
					X509_free(x509);
				}
				CertFreeCertificateContext(ctx);
				CertCloseStore(system_store, 0);
			}
		}

		SSL_CTX* ssl_ctx = m_ssl_ctx.native_handle();
		SSL_CTX_set_cert_store(ssl_ctx, store);
#endif
#ifdef __APPLE__
		m_ssl_ctx.load_verify_file("/etc/ssl/cert.pem", ec);
#ifndef TORRENT_DISABLE_LOGGING
		if (ec) session_log("SSL load_verify_file failed: %s", ec.message().c_str());
		ec.clear();
#endif
		m_ssl_ctx.add_verify_path("/etc/ssl/certs", ec);
#ifndef TORRENT_DISABLE_LOGGING
		if (ec) session_log("SSL add_verify_path failed: %s", ec.message().c_str());
		ec.clear();
#endif
#endif // __APPLE__
#endif // TORRENT_USE_SSL
#ifdef TORRENT_SSL_PEERS
		m_peer_ssl_ctx.set_verify_mode(ssl::context::verify_none, ec);
		ssl::set_server_name_callback(ssl::get_handle(m_peer_ssl_ctx), ssl_server_name_callback, this, ec);
#endif // TORRENT_SSL_PEERS

#ifndef TORRENT_DISABLE_DHT
		m_next_dht_torrent = 0;
#endif
		m_next_lsd_torrent = 0;

		m_global_class = m_classes.new_peer_class("global");
		m_tcp_peer_class = m_classes.new_peer_class("tcp");
		m_local_peer_class = m_classes.new_peer_class("local");
		// local peers are always unchoked
		m_classes.at(m_local_peer_class)->ignore_unchoke_slots = true;
		// local peers are allowed to exceed the normal connection
		// limit by 50%
		m_classes.at(m_local_peer_class)->connection_limit_factor = 150;

		TORRENT_ASSERT(m_global_class == session::global_peer_class_id);
		TORRENT_ASSERT(m_tcp_peer_class == session::tcp_peer_class_id);
		TORRENT_ASSERT(m_local_peer_class == session::local_peer_class_id);

		init_peer_class_filter(true);

		// TCP, SSL/TCP and I2P connections should be assigned the TCP peer class
		m_peer_class_type_filter.add(peer_class_type_filter::tcp_socket, m_tcp_peer_class);
		m_peer_class_type_filter.add(peer_class_type_filter::ssl_tcp_socket, m_tcp_peer_class);
		m_peer_class_type_filter.add(peer_class_type_filter::i2p_socket, m_tcp_peer_class);

#ifndef TORRENT_DISABLE_LOGGING

		session_log("version: %s revision: %" PRIx64
			, lt::version_str, lt::version_revision);

#endif // TORRENT_DISABLE_LOGGING

		// ---- auto-cap max connections ----
		int const max_files = max_open_files();
		// deduct some margin for epoll/kqueue, log files,
		// futexes, shared objects etc.
		// 80% of the available file descriptors should go to connections
		m_settings.set_int(settings_pack::connections_limit, std::min(
			m_settings.get_int(settings_pack::connections_limit)
			, std::max(5, (max_files - 20) * 8 / 10)));
		// 20% goes towards regular files (see disk_io_thread)
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			session_log("max-connections: %d max-files: %d"
				, m_settings.get_int(settings_pack::connections_limit)
				, max_files);
		}
#endif

		post(m_io_context, [this] { wrap(&session_impl::init); });
	}